

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reusable_string_stream.hpp
# Opt level: O2

ReusableStringStream * __thiscall
Catch::ReusableStringStream::operator<<(ReusableStringStream *this,SwapchainError *value)

{
  basic_ostream<char,_std::char_traits<char>_> *__os;
  error_code eStack_28;
  
  __os = this->m_oss;
  std::error_code::error_code<vkb::SwapchainError,void>(&eStack_28,*value);
  std::operator<<(__os,&eStack_28);
  return this;
}

Assistant:

auto operator << ( T const& value ) -> ReusableStringStream& {
            *m_oss << value;
            return *this;
        }